

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vehicle.cpp
# Opt level: O2

bool __thiscall Vehicle::collides_with(Vehicle *this,Vehicle *other,double time_t)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Position PVar4;
  Position PVar5;
  
  PVar4 = position_at(this,time_t);
  PVar5 = position_at(other,time_t);
  if ((PVar4.first != PVar5.first) || (NAN(PVar4.first) || NAN(PVar5.first))) {
    bVar1 = false;
  }
  else {
    iVar3 = PVar4.second - PVar5.second;
    iVar2 = -iVar3;
    if (0 < iVar3) {
      iVar2 = iVar3;
    }
    bVar1 = iVar2 <= this->m_L;
  }
  return bVar1;
}

Assistant:

bool Vehicle::collides_with(Vehicle other, double time_t)
{
	/*
    Simple collision detection.
    */
    Position vehicle_1 = position_at(time_t);
    Position vehicle_2 = other.position_at(time_t);
    return (vehicle_1.first == vehicle_2.first) && (abs(vehicle_1.second-vehicle_2.second) <= m_L);
}